

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepsBuildEngineTest.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::DepsBuildEngineTest_BogusConcurrentDepScan_Test::TestBody()::DynamicTask::
inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  TaskInterface local_38;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  local_38.ctx = ti.ctx;
  local_38.impl = ti.impl;
  anon_unknown.dwarf_83776::intToValue((ValueType *)&local_28,*(int32_t *)((long)this + 8));
  llbuild::core::TaskInterface::complete(&local_38,(ValueType *)&local_28,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
      ti.complete(intToValue(result));
    }